

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_poller.cpp
# Opt level: O0

int __thiscall zmq::socket_poller_t::remove_fd(socket_poller_t *this,fd_t fd_)

{
  bool bVar1;
  iterator __position;
  int *piVar2;
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  *in_RDI;
  iterator it;
  vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
  *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb8;
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  in_stack_ffffffffffffffc8;
  int local_4;
  
  std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::begin
            (in_stack_ffffffffffffffa8);
  std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::end
            (in_stack_ffffffffffffffa8);
  find_if2<__gnu_cxx::__normal_iterator<zmq::socket_poller_t::item_t*,std::vector<zmq::socket_poller_t::item_t,std::allocator<zmq::socket_poller_t::item_t>>>,int,bool(*)(zmq::socket_poller_t::item_t_const&,int)>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (_func_bool_item_t_ptr_int *)in_RDI);
  __position = std::
               vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::
               end(in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::operator==
                    (in_RDI,(__normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
                             *)in_stack_ffffffffffffffa8);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    local_4 = -1;
  }
  else {
    __gnu_cxx::
    __normal_iterator<zmq::socket_poller_t::item_t_const*,std::vector<zmq::socket_poller_t::item_t,std::allocator<zmq::socket_poller_t::item_t>>>
    ::__normal_iterator<zmq::socket_poller_t::item_t*>
              ((__normal_iterator<const_zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
                *)in_RDI,
               (__normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
                *)((__normal_iterator<const_zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
                    *)in_RDI + 2));
    std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::erase
              ((vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
                *)in_stack_ffffffffffffffc0._M_current,(const_iterator)__position._M_current);
    *(undefined1 *)
     &((__normal_iterator<const_zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
        *)in_RDI)[5]._M_current = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::socket_poller_t::remove_fd (fd_t fd_)
{
    const items_t::iterator it =
      find_if2 (_items.begin (), _items.end (), fd_, &is_fd);

    if (it == _items.end ()) {
        errno = EINVAL;
        return -1;
    }

    _items.erase (it);
    _need_rebuild = true;

    return 0;
}